

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O3

void __thiscall psy::C::NameCataloger::NameCataloger(NameCataloger *this,SyntaxTree *tree)

{
  NameCatalog *this_00;
  
  SyntaxVisitor::SyntaxVisitor(&this->super_SyntaxVisitor,tree);
  (this->super_SyntaxVisitor)._vptr_SyntaxVisitor = (_func_int **)&PTR__NameCataloger_0051ef60;
  this_00 = (NameCatalog *)operator_new(0x88);
  *(_Elt_pointer *)((long)&(this_00->enclosureStack_).c + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)((long)&(this_00->enclosureStack_).c + 0x48) = (_Map_pointer)0x0;
  ((iterator *)((long)&(this_00->enclosureStack_).c + 0x30))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->enclosureStack_).c + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->enclosureStack_).c + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)((long)&(this_00->enclosureStack_).c + 0x28) = (_Map_pointer)0x0;
  ((iterator *)((long)&(this_00->enclosureStack_).c + 0x10))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->enclosureStack_).c + 0x18) = (_Elt_pointer)0x0;
  *(undefined8 *)&(this_00->enclosureStack_).c = 0;
  *(size_t *)((long)&(this_00->enclosureStack_).c + 8) = 0;
  std::_Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>::
  _M_initialize_map((_Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                     *)this_00,0);
  (this_00->enclosureIdx_)._M_h._M_buckets =
       (__node_base_ptr *)((long)&(this_00->enclosureIdx_)._M_h + 0x30);
  *(size_type *)((long)&(this_00->enclosureIdx_)._M_h + 8) = 1;
  ((__node_base *)((long)&(this_00->enclosureIdx_)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)((long)&(this_00->enclosureIdx_)._M_h + 0x18) = 0;
  ((_Prime_rehash_policy *)((long)&(this_00->enclosureIdx_)._M_h + 0x20))->_M_max_load_factor = 1.0;
  *(size_t *)((long)&(this_00->enclosureIdx_)._M_h + 0x28) = 0;
  *(__node_base_ptr *)((long)&(this_00->enclosureIdx_)._M_h + 0x30) = (__node_base_ptr)0x0;
  (this->catalog_)._M_t.
  super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>.
  super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl = this_00;
  this->withinTypedef_ = false;
  return;
}

Assistant:

NameCataloger::NameCataloger(SyntaxTree* tree)
    : SyntaxVisitor(tree)
    , catalog_(new NameCatalog)
    , withinTypedef_(false)
{}